

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.cpp
# Opt level: O1

void __thiscall
sc_core::sc_signal<bool,_(sc_core::sc_writer_policy)0>::do_update
          (sc_signal<bool,_(sc_core::sc_writer_policy)0> *this)

{
  sc_signal_channel *this_00;
  
  this_00 = &(this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).super_sc_signal_channel;
  sc_signal_channel::notify_next_delta
            (this_00,(this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).
                     super_sc_signal_channel.m_change_event_p);
  (this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).super_sc_signal_channel.
  m_change_stamp =
       ((this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).super_sc_signal_channel.
        super_sc_prim_channel.super_sc_object.m_simc)->m_change_stamp;
  (this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).m_cur_val =
       (this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).m_new_val;
  if (this->m_reset_p != (sc_reset *)0x0) {
    sc_reset::notify_processes(this->m_reset_p);
  }
  sc_signal_channel::notify_next_delta
            (this_00,(&this->m_negedge_event_p)
                     [(this->super_sc_signal_t<bool,_(sc_core::sc_writer_policy)0>).m_cur_val]);
  return;
}

Assistant:

void
sc_signal<bool,POL>::do_update()
{
    // order of execution below is important, the notify_processes() call
    // must come after the update of m_cur_val for things to work properly!
    base_type::do_update();
    if ( m_reset_p ) m_reset_p->notify_processes();

    sc_event* event_p = this->m_cur_val ? m_posedge_event_p : m_negedge_event_p;
    sc_signal_channel::notify_next_delta( event_p );
}